

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O2

Vec_Wec_t * Gia_ManIsoStrashReduceInt(Gia_Man_t *p,Vec_Wec_t *vSupps,int fVerbose)

{
  int iVar1;
  int iVar2;
  Vec_Wec_t *p_00;
  Vec_Int_t *p_01;
  Vec_Int_t *p_02;
  Vec_Int_t *pVVar3;
  Gia_Man_t *p_03;
  Gia_Obj_t *pObj;
  int iVar4;
  
  p_00 = Vec_WecAlloc(100);
  p_01 = Vec_IntAlloc(10000);
  iVar1 = Gia_ManCoSuppSizeMax(p,vSupps);
  p_02 = Vec_IntStart(iVar1 + 1);
  iVar4 = 0;
  while( true ) {
    if (vSupps->nSize <= iVar4) {
      Gia_ManFillValue(p);
      p_03 = Gia_ManStart(p->nObjs);
      p->pObjs->Value = 0;
      iVar4 = 0;
      if (0 < iVar1) {
        iVar4 = iVar1;
      }
      while (iVar4 != 0) {
        Gia_ManAppendCi(p_03);
        iVar4 = iVar4 + -1;
      }
      Gia_ManHashAlloc(p_03);
      iVar1 = 0;
      while ((iVar1 < p->vCos->nSize && (pObj = Gia_ManCo(p,iVar1), pObj != (Gia_Obj_t *)0x0))) {
        pVVar3 = Vec_WecEntry(vSupps,iVar1);
        iVar4 = Vec_IntEntry(p_02,pVVar3->nSize);
        if (iVar4 == 1) {
          pVVar3 = Vec_WecPushLevel(p_00);
          Vec_IntPush(pVVar3,iVar1);
        }
        else {
          iVar4 = Gia_ManIsoStrashReduceOne(p_03,p,pObj,pVVar3);
          Vec_IntFillExtra(p_01,iVar4 + 1,-1);
          iVar2 = Vec_IntEntry(p_01,iVar4);
          if (iVar2 == -1) {
            Vec_IntWriteEntry(p_01,iVar4,p_00->nSize);
            pVVar3 = Vec_WecPushLevel(p_00);
          }
          else {
            iVar4 = Vec_IntEntry(p_01,iVar4);
            pVVar3 = Vec_WecEntry(p_00,iVar4);
          }
          Vec_IntPush(pVVar3,iVar1);
        }
        iVar1 = iVar1 + 1;
      }
      Gia_ManHashStop(p_03);
      Gia_ManStop(p_03);
      Vec_IntFree(p_02);
      Vec_IntFree(p_01);
      return p_00;
    }
    pVVar3 = Vec_WecEntry(vSupps,iVar4);
    iVar2 = pVVar3->nSize;
    if (((long)iVar2 < 0) || (p_02->nSize <= iVar2)) break;
    p_02->pArray[iVar2] = p_02->pArray[iVar2] + 1;
    iVar4 = iVar4 + 1;
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                ,0x1dc,"int Vec_IntAddToEntry(Vec_Int_t *, int, int)");
}

Assistant:

Vec_Wec_t * Gia_ManIsoStrashReduceInt( Gia_Man_t * p, Vec_Wec_t * vSupps, int fVerbose )
{
    Gia_Man_t * pNew;
    Gia_Obj_t * pObj;
    Vec_Wec_t * vPosEquivs = Vec_WecAlloc( 100 );
    Vec_Int_t * vSuppOne, * vMap = Vec_IntAlloc( 10000 );
    int i, iLit, nSuppMax = Gia_ManCoSuppSizeMax( p, vSupps );
    // count how many times each support size appears
    Vec_Int_t * vSizeCount = Vec_IntStart( nSuppMax + 1 );
    Vec_WecForEachLevel( vSupps, vSuppOne, i )
        Vec_IntAddToEntry( vSizeCount, Vec_IntSize(vSuppOne), 1 );
    // create array of unique outputs
    Gia_ManFillValue( p );
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    Gia_ManConst0(p)->Value = 0;
    for ( i = 0; i < nSuppMax; i++ )
        Gia_ManAppendCi(pNew);
    Gia_ManHashAlloc( pNew );
    Gia_ManForEachCo( p, pObj, i )
    {
        vSuppOne = Vec_WecEntry( vSupps, i );
        if ( Vec_IntEntry(vSizeCount, Vec_IntSize(vSuppOne)) == 1 )
        {
            Vec_IntPush( Vec_WecPushLevel(vPosEquivs), i );
            continue;
        }
        iLit = Gia_ManIsoStrashReduceOne( pNew, p, pObj, vSuppOne );
        Vec_IntFillExtra( vMap, iLit + 1, -1 );
        if ( Vec_IntEntry(vMap, iLit) == -1 )
        {
            Vec_IntWriteEntry( vMap, iLit, Vec_WecSize(vPosEquivs) );
            Vec_IntPush( Vec_WecPushLevel(vPosEquivs), i );
            continue;
        }
        Vec_IntPush( Vec_WecEntry(vPosEquivs, Vec_IntEntry(vMap, iLit)), i );
    }
    Gia_ManHashStop( pNew );
    Gia_ManStop( pNew );
    Vec_IntFree( vSizeCount );
    Vec_IntFree( vMap );
    return vPosEquivs;
}